

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsVarSerializerSetTransferableVars
          (JsVarSerializerHandle serializerHandle,JsValueRef *transferableVars,
          size_t transferableVarsCount)

{
  anon_class_24_3_c52a90ce fn;
  size_t local_28;
  size_t transferableVarsCount_local;
  JsValueRef *transferableVars_local;
  JsVarSerializerHandle serializerHandle_local;
  
  if (serializerHandle == (JsVarSerializerHandle)0x0) {
    serializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.transferableVars = (JsValueRef **)&transferableVarsCount_local;
    fn.serializerHandle = &transferableVars_local;
    fn.transferableVarsCount = &local_28;
    local_28 = transferableVarsCount;
    transferableVarsCount_local = (size_t)transferableVars;
    transferableVars_local = (JsValueRef *)serializerHandle;
    serializerHandle_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarSerializerSetTransferableVars::__0>(fn,false,false)
    ;
  }
  return serializerHandle_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarSerializerSetTransferableVars(
    _In_ JsVarSerializerHandle serializerHandle,
    _In_opt_ JsValueRef *transferableVars,
    _In_ size_t transferableVarsCount)
{
    PARAM_NOT_NULL(serializerHandle);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        return streamWriter->SetTransferableVars(transferableVars, transferableVarsCount);
    });

}